

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O3

int __thiscall ktx::CommandInfo::main(CommandInfo *this,int argc,char **argv)

{
  string local_78;
  string local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ktx info","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Prints information about the KTX2 file specified as the input-file argument.\n    The command implicitly calls validate and prints any found errors\n    and warnings to stdout."
             ,"");
  Command::parseCommandLine(&this->super_Command,&local_78,&local_50,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  executeInfo(this);
  return 0;
}

Assistant:

int CommandInfo::main(int argc, char* argv[]) {
    try {
        parseCommandLine("ktx info",
                "Prints information about the KTX2 file specified as the input-file argument.\n"
                "    The command implicitly calls validate and prints any found errors\n"
                "    and warnings to stdout.",
                argc, argv);
        executeInfo();
        return to_underlying(rc::SUCCESS);
    } catch (const FatalError& error) {
        return +error.returnCode;
    } catch (const std::exception& e) {
        fmt::print(std::cerr, "{} fatal: {}\n", commandName, e.what());
        return +rc::RUNTIME_ERROR;
    }
}